

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::udiv(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint uVar2;
  uint64_t in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  uint numBits;
  APInt AVar4;
  uint64_t uStack_40;
  uint64_t RHS_local;
  
  if (in_RDX == 0) {
    __assert_fail("RHS != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x621,"APInt llvm::APInt::udiv(uint64_t) const");
  }
  numBits = *(uint *)(RHS + 8);
  if (numBits < 0x41) {
    uStack_40 = *(uint64_t *)RHS;
LAB_0016dd5c:
    uStack_40 = uStack_40 / in_RDX;
  }
  else {
    uVar2 = getActiveBits((APInt *)RHS);
    if (uVar2 != 0) {
      if (in_RDX == 1) {
        APInt(this,(APInt *)RHS);
        uVar3 = extraout_RDX;
        goto LAB_0016dda9;
      }
      bVar1 = ult((APInt *)RHS,in_RDX);
      if (!bVar1) {
        bVar1 = operator==((APInt *)RHS,in_RDX);
        if (!bVar1) {
          numBits = *(uint *)(RHS + 8);
          uVar2 = (uint)((ulong)uVar2 + 0x3f >> 6);
          if (uVar2 != 1) {
            APInt(this,numBits,0,false);
            divide(*(WordType **)RHS,uVar2,&RHS_local,1,(this->U).pVal,(WordType *)0x0);
            uVar3 = extraout_RDX_01;
            goto LAB_0016dda9;
          }
          uStack_40 = **(ulong **)RHS;
          goto LAB_0016dd5c;
        }
        numBits = *(uint *)(RHS + 8);
        uStack_40 = 1;
        goto LAB_0016dda2;
      }
    }
    numBits = *(uint *)(RHS + 8);
    uStack_40 = 0;
  }
LAB_0016dda2:
  APInt(this,numBits,uStack_40,false);
  uVar3 = extraout_RDX_00;
LAB_0016dda9:
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::udiv(uint64_t RHS) const {
  assert(RHS != 0 && "Divide by zero?");

  // First, deal with the easy case
  if (isSingleWord())
    return APInt(BitWidth, U.VAL / RHS);

  // Get some facts about the LHS words.
  unsigned lhsWords = getNumWords(getActiveBits());

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (RHS == 1)
    // X / 1 ===> X
    return *this;
  if (this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, &RHS, 1, Quotient.U.pVal, nullptr);
  return Quotient;
}